

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

int move_reading_point(archive_read *a,uint64_t offset)

{
  long *plVar1;
  long request;
  int64_t iVar2;
  int64_t pos;
  int64_t step;
  xar *xar;
  uint64_t offset_local;
  archive_read *a_local;
  
  plVar1 = (long *)a->format->data;
  if (*plVar1 - plVar1[2] != offset) {
    request = offset - (*plVar1 - plVar1[2]);
    if (request < 1) {
      iVar2 = __archive_read_seek(a,plVar1[2] + offset,0);
      if (iVar2 == -0x19) {
        archive_set_error(&a->archive,-1,"Cannot seek.");
        return -0x19;
      }
      *plVar1 = iVar2;
    }
    else {
      iVar2 = __archive_read_consume(a,request);
      if (iVar2 < 0) {
        return (int)iVar2;
      }
      *plVar1 = iVar2 + *plVar1;
    }
  }
  return 0;
}

Assistant:

static int
move_reading_point(struct archive_read *a, uint64_t offset)
{
	struct xar *xar;

	xar = (struct xar *)(a->format->data);
	if (xar->offset - xar->h_base != offset) {
		/* Seek forward to the start of file contents. */
		int64_t step;

		step = offset - (xar->offset - xar->h_base);
		if (step > 0) {
			step = __archive_read_consume(a, step);
			if (step < 0)
				return ((int)step);
			xar->offset += step;
		} else {
			int64_t pos = __archive_read_seek(a, xar->h_base + offset, SEEK_SET);
			if (pos == ARCHIVE_FAILED) {
				archive_set_error(&(a->archive),
				    ARCHIVE_ERRNO_MISC,
				    "Cannot seek.");
				return (ARCHIVE_FAILED);
			}
			xar->offset = pos;
		}
	}
	return (ARCHIVE_OK);
}